

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
int_writer<int,_fmt::v5::basic_format_specs<char>_>::on_oct
          (int_writer<int,_fmt::v5::basic_format_specs<char>_> *this)

{
  basic_format_specs<char> *spec;
  uint uVar1;
  int num_digits;
  uint uVar2;
  bin_writer<3> bVar3;
  bin_writer<3> f;
  string_view prefix;
  
  uVar1 = this->abs_value;
  bVar3.num_digits = 0;
  bVar3.abs_value = uVar1;
  num_digits = 0;
  f = bVar3;
  do {
    f = (bin_writer<3>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    uVar1 = uVar1 >> 3;
    uVar2 = bVar3.abs_value;
    bVar3.num_digits = 0;
    bVar3.abs_value = uVar1;
  } while (7 < uVar2);
  spec = this->spec;
  if ((((spec->super_core_format_specs).flags & 8) != 0) &&
     ((spec->super_core_format_specs).precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>> *
             )this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>();
      if (spec.has(HASH_FLAG) &&
          spec.precision <= num_digits) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }